

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

int __thiscall Ptex::v2_2::PtexReader::open(PtexReader *this,char *__file,int __oflag,...)

{
  PtexErrorHandler *pPVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  ostream *poVar6;
  undefined8 extraout_RAX;
  ulong uVar7;
  long lVar8;
  FilePos pos;
  PtexErrorHandler *prevErr;
  TempErrorHandler tempErr;
  stringstream s;
  string errstr_1;
  string errstr;
  AutoMutex locker;
  Mutex *in_stack_fffffffffffffd08;
  PtexReader *in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  void *in_stack_fffffffffffffd20;
  PtexReader *this_00;
  PtexReader *in_stack_fffffffffffffd28;
  PtexReader *this_01;
  undefined4 in_stack_fffffffffffffd30;
  allocator<char> *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  undefined1 local_260 [72];
  stringstream local_218 [16];
  ostream local_208 [383];
  allocator<char> local_89;
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [32];
  _Vector_impl local_40;
  string *local_28;
  char *local_20;
  PtexReader *local_18;
  undefined1 local_a;
  undefined1 local_9;
  bool *local_8;
  
  local_28 = ___oflag;
  local_20 = __file;
  local_18 = this;
  AutoLock<Ptex::v2_2::Mutex>::AutoLock
            ((AutoLock<Ptex::v2_2::Mutex> *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  bVar2 = needToOpen(this);
  if (bVar2) {
    bVar2 = LittleEndian();
    if (bVar2) {
      std::__cxx11::string::operator=((string *)&this->_path,local_20);
      iVar3 = (*this->_io->_vptr_PtexInputHandler[2])(this->_io,local_20);
      this->_fp = (Handle)CONCAT44(extraout_var,iVar3);
      if (this->_fp == (Handle)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
        std::allocator<char>::~allocator(&local_61);
        std::__cxx11::string::operator+=(local_60,local_20);
        std::__cxx11::string::operator+=(local_60,"\n");
        iVar3 = (*this->_io->_vptr_PtexInputHandler[6])();
        std::__cxx11::string::operator+=(local_60,(char *)CONCAT44(extraout_var_00,iVar3));
        pcVar5 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::string::operator=(local_28,pcVar5);
        this->_ok = false;
        local_a = 0;
        local_40.super__Tp_alloc_type = (_Tp_alloc_type)0x1;
        local_40._1_3_ = 0;
        std::__cxx11::string::~string(local_60);
      }
      else {
        (this->_header).leveldatasize = 0;
        (this->_header).metadatazipsize = 0;
        (this->_header).metadatamemsize = 0;
        (this->_header).faceinfosize = 0;
        (this->_header).constdatasize = 0;
        (this->_header).levelinfosize = 0;
        (this->_header).minorversion = 0;
        (this->_header).alphachan = 0;
        (this->_header).nchannels = 0;
        (this->_header).nlevels = 0;
        (this->_header).nfaces = 0;
        (this->_header).extheadersize = 0;
        (this->_header).magic = 0;
        (this->_header).version = 0;
        (this->_header).meshtype = 0;
        (this->_header).datatype = 0;
        readBlock(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                  (int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                  SUB81((ulong)in_stack_fffffffffffffd18 >> 0x18,0));
        if ((this->_header).magic == 0x78657450) {
          if ((this->_header).version == 1) {
            iVar3 = Header::pixelSize((Header *)in_stack_fffffffffffffd10);
            this->_pixelsize = iVar3;
            std::vector<char,_std::allocator<char>_>::resize
                      ((vector<char,_std::allocator<char>_> *)
                       CONCAT44(iVar3,in_stack_fffffffffffffd30),
                       (size_type)in_stack_fffffffffffffd28);
            this_00 = (PtexReader *)local_260;
            anon_unknown.dwarf_28186::TempErrorHandler::TempErrorHandler
                      ((TempErrorHandler *)in_stack_fffffffffffffd10);
            pPVar1 = this->_err;
            this->_err = (PtexErrorHandler *)this_00;
            this_01 = (PtexReader *)&this->_extheader;
            (this->_extheader).lmddatasize = 0;
            (this->_extheader).editdatasize = 0;
            (this->_extheader).ubordermode = 0;
            (this->_extheader).pad = 0;
            (this->_extheader).vbordermode = 0;
            (this->_extheader).edgefiltermode = 0;
            (this->_extheader).lmdheaderzipsize = 0;
            (this->_extheader).lmdheadermemsize = 0;
            (this->_extheader).editdatapos = 0;
            uVar4 = PtexUtils::min<unsigned_int>(0x28,(this->_header).extheadersize);
            readBlock(this_01,this_00,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                      SUB81((ulong)in_stack_fffffffffffffd18 >> 0x18,0));
            uVar7 = (ulong)((this->_header).extheadersize + 0x40);
            this->_faceinfopos = uVar7;
            lVar8 = uVar7 + (this->_header).faceinfosize;
            this->_constdatapos = lVar8;
            lVar8 = lVar8 + (ulong)(this->_header).constdatasize;
            this->_levelinfopos = lVar8;
            lVar8 = lVar8 + (ulong)(this->_header).levelinfosize;
            this->_leveldatapos = lVar8;
            lVar8 = lVar8 + (this->_header).leveldatasize;
            this->_metadatapos = lVar8;
            lVar8 = lVar8 + (ulong)(this->_header).metadatazipsize + 8;
            this->_lmdheaderpos = lVar8;
            lVar8 = lVar8 + (ulong)(this->_extheader).lmdheaderzipsize;
            this->_lmddatapos = lVar8;
            lVar8 = PtexUtils::max<long>
                              ((this->_extheader).editdatapos,lVar8 + (this->_extheader).lmddatasize
                              );
            this->_editdatapos = lVar8;
            readFaceInfo(this);
            readConstData(this_00);
            readLevelInfo(this_00);
            readEditData((PtexReader *)CONCAT44(iVar3,uVar4));
            this->_baseMemUsed = this->_memUsed;
            this->_err = pPVar1;
            local_a = (this->_ok & 1U) != 0;
            if ((bool)local_a) {
              local_8 = &this->_needToOpen;
              local_9 = 0;
              *local_8 = false;
            }
            else {
              in_stack_fffffffffffffd10 =
                   (PtexReader *)
                   ::(anonymous_namespace)::TempErrorHandler::getErrorString_abi_cxx11_
                             ((TempErrorHandler *)local_260);
              std::__cxx11::string::operator=(local_28,(string *)in_stack_fffffffffffffd10);
              closeFP(in_stack_fffffffffffffd10);
            }
            local_40.super__Tp_alloc_type = (_Tp_alloc_type)0x1;
            local_40._1_3_ = 0;
            anon_unknown.dwarf_28186::TempErrorHandler::~TempErrorHandler
                      ((TempErrorHandler *)in_stack_fffffffffffffd10);
          }
          else {
            std::__cxx11::stringstream::stringstream(local_218);
            poVar6 = std::operator<<(local_208,"Unsupported ptex file version (");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,(this->_header).version);
            poVar6 = std::operator<<(poVar6,"): ");
            std::operator<<(poVar6,local_20);
            std::__cxx11::stringstream::str();
            std::__cxx11::string::operator=(local_28,(string *)(local_260 + 0x28));
            std::__cxx11::string::~string((string *)(local_260 + 0x28));
            this->_ok = false;
            closeFP(in_stack_fffffffffffffd10);
            local_a = 0;
            local_40.super__Tp_alloc_type = (_Tp_alloc_type)0x1;
            local_40._1_3_ = 0;
            std::__cxx11::stringstream::~stringstream(local_218);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
          std::allocator<char>::~allocator(&local_89);
          std::__cxx11::string::operator+=(local_88,local_20);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          std::__cxx11::string::operator=(local_28,pcVar5);
          this->_ok = false;
          closeFP(in_stack_fffffffffffffd10);
          local_a = 0;
          local_40.super__Tp_alloc_type = (_Tp_alloc_type)0x1;
          local_40._1_3_ = 0;
          std::__cxx11::string::~string(local_88);
        }
      }
    }
    else {
      std::__cxx11::string::operator=
                (local_28,"Ptex library doesn\'t currently support big-endian cpu\'s");
      local_a = 0;
      local_40.super__Tp_alloc_type = (_Tp_alloc_type)0x1;
      local_40._1_3_ = 0;
    }
  }
  else {
    local_a = 0;
    local_40.super__Tp_alloc_type = (_Tp_alloc_type)0x1;
    local_40._1_3_ = 0;
  }
  AutoLock<Ptex::v2_2::Mutex>::~AutoLock((AutoLock<Ptex::v2_2::Mutex> *)0x133cf7);
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),local_a) & 0xffffff01;
}

Assistant:

bool PtexReader::open(const char* pathArg, Ptex::String& error)
{
    AutoMutex locker(readlock);
    if (!needToOpen()) return false;

    if (!LittleEndian()) {
        error = "Ptex library doesn't currently support big-endian cpu's";
        return 0;
    }
    _path = pathArg;
    _fp = _io->open(pathArg);
    if (!_fp) {
        std::string errstr = "Can't open ptex file: ";
        errstr += pathArg; errstr += "\n"; errstr += _io->lastError();
        error = errstr.c_str();
        _ok = 0;
        return 0;
    }
    memset(&_header, 0, sizeof(_header));
    readBlock(&_header, HeaderSize);
    if (_header.magic != Magic) {
        std::string errstr = "Not a ptex file: "; errstr += pathArg;
        error = errstr.c_str();
        _ok = 0;
        closeFP();
        return 0;
    }
    if (_header.version != 1) {
        std::stringstream s;
        s << "Unsupported ptex file version ("<< _header.version << "): " << pathArg;
        error = s.str();
        _ok = 0;
        closeFP();
        return 0;
    }
    _pixelsize = _header.pixelSize();
    _errorPixel.resize(_pixelsize);

    // install temp error handler to capture error (to return in error param)
    TempErrorHandler tempErr;
    PtexErrorHandler* prevErr = _err;
    _err = &tempErr;

    // read extended header
    memset(&_extheader, 0, sizeof(_extheader));
    readBlock(&_extheader, PtexUtils::min(uint32_t(ExtHeaderSize), _header.extheadersize));

    // compute offsets of various blocks
    FilePos pos = HeaderSize + _header.extheadersize;
    _faceinfopos = pos;   pos += _header.faceinfosize;
    _constdatapos = pos;  pos += _header.constdatasize;
    _levelinfopos = pos;  pos += _header.levelinfosize;
    _leveldatapos = pos;  pos += _header.leveldatasize;
    _metadatapos = pos;   pos += _header.metadatazipsize;
                          pos += sizeof(uint64_t); // compatibility barrier
    _lmdheaderpos = pos;  pos += _extheader.lmdheaderzipsize;
    _lmddatapos = pos;    pos += _extheader.lmddatasize;

    // edit data may not start immediately if additional sections have been added
    // use value from extheader if present (and > pos)
    _editdatapos = PtexUtils::max(FilePos(_extheader.editdatapos), pos);

    // read basic file info
    readFaceInfo();
    readConstData();
    readLevelInfo();
    readEditData();
    _baseMemUsed = _memUsed;

    // restore error handler
    _err = prevErr;

    // an error occurred while reading the file
    if (!_ok) {
        error = tempErr.getErrorString();
        closeFP();
        return 0;
    }
    AtomicStore(&_needToOpen, false);
    return true;
}